

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number.cpp
# Opt level: O0

Variable __thiscall LiteScript::_Type_NUMBER::OAdd(_Type_NUMBER *this,Variable *obj1,Variable *obj2)

{
  bool bVar1;
  Object *pOVar2;
  Type *pTVar3;
  Number *pNVar4;
  Variable *in_RCX;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *puVar5;
  Variable VVar6;
  Number local_60;
  undefined1 local_55;
  Number local_54;
  undefined1 local_49;
  undefined4 local_48;
  undefined1 local_38 [8];
  Variable tmp;
  Variable *obj2_local;
  Variable *obj1_local;
  _Type_NUMBER *this_local;
  Variable *res;
  
  tmp.nb_ref = (uint *)in_RCX;
  pOVar2 = Variable::operator->(in_RCX);
  pTVar3 = Object::GetType(pOVar2);
  bVar1 = Type::operator!=(pTVar3,(Type *)obj1);
  if (bVar1) {
    Variable::Convert((Variable *)local_38,(Type *)tmp.nb_ref);
    pOVar2 = Variable::operator->((Variable *)local_38);
    pTVar3 = Object::GetType(pOVar2);
    bVar1 = Type::operator!=(pTVar3,(Type *)obj1);
    if (bVar1) {
      pOVar2 = Variable::operator->(obj2);
      Memory::Create((Memory *)this,(Type *)pOVar2->memory);
    }
    else {
      local_49 = 0;
      pOVar2 = Variable::operator->(obj2);
      Memory::Create((Memory *)this,(Type *)pOVar2->memory);
      pOVar2 = Variable::operator->(obj2);
      pNVar4 = Object::GetData<LiteScript::Number>(pOVar2);
      pOVar2 = Variable::operator->((Variable *)local_38);
      Object::GetData<LiteScript::Number>(pOVar2);
      Number::operator+(&local_54,pNVar4);
      pOVar2 = Variable::operator->((Variable *)this);
      pNVar4 = Object::GetData<LiteScript::Number>(pOVar2);
      Number::operator=(pNVar4,&local_54);
      local_49 = 1;
    }
    local_48 = 1;
    Variable::~Variable((Variable *)local_38);
    puVar5 = extraout_RDX;
  }
  else {
    local_55 = 0;
    pOVar2 = Variable::operator->(obj2);
    Memory::Create((Memory *)this,(Type *)pOVar2->memory);
    pOVar2 = Variable::operator->(obj2);
    pNVar4 = Object::GetData<LiteScript::Number>(pOVar2);
    pOVar2 = Variable::operator->((Variable *)tmp.nb_ref);
    Object::GetData<LiteScript::Number>(pOVar2);
    Number::operator+(&local_60,pNVar4);
    pOVar2 = Variable::operator->((Variable *)this);
    pNVar4 = Object::GetData<LiteScript::Number>(pOVar2);
    Number::operator=(pNVar4,&local_60);
    puVar5 = extraout_RDX_00;
  }
  VVar6.nb_ref = puVar5;
  VVar6.obj = (Object *)this;
  return VVar6;
}

Assistant:

LiteScript::Variable LiteScript::_Type_NUMBER::OAdd(const LiteScript::Variable& obj1, const LiteScript::Variable& obj2) const {
    if (obj2->GetType() != *this) {
        Variable tmp = obj2.Convert(*this);
        if (tmp->GetType() != *this)
            return obj1->memory.Create(Type::NIL);
        Variable res = obj1->memory.Create(Type::NUMBER);
        res->GetData<Number>() = obj1->GetData<Number>() + tmp->GetData<Number>();
        return res;
    }
    Variable res = obj1->memory.Create(Type::NUMBER);
    res->GetData<Number>() = obj1->GetData<Number>() + obj2->GetData<Number>();
    return res;
}